

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginOperatorInterface.cpp
# Opt level: O0

void __thiscall
adios2::plugin::PluginOperatorInterface::PluginOperatorInterface
          (PluginOperatorInterface *this,Params *parameters)

{
  undefined8 *in_RDI;
  allocator local_69;
  string local_68 [8];
  Params *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  OperatorType in_stack_ffffffffffffffb7;
  string *in_stack_ffffffffffffffb8;
  Operator *in_stack_ffffffffffffffc0;
  allocator local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"PluginInterface",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"plugin",&local_69);
  core::Operator::Operator
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb7,
             in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  *in_RDI = &PTR__PluginOperatorInterface_01133728;
  return;
}

Assistant:

PluginOperatorInterface::PluginOperatorInterface(const Params &parameters)
: Operator("PluginInterface", PLUGIN_INTERFACE, "plugin", parameters)
{
}